

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupCofactorVar(Gia_Man_t *p,int iVar,int Value)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  if ((iVar < 0) || (p->vCis->nSize - p->nRegs <= iVar)) {
    __assert_fail("iVar >= 0 && iVar < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x64b,"Gia_Man_t *Gia_ManDupCofactorVar(Gia_Man_t *, int, int)");
  }
  if (1 < (uint)Value) {
    __assert_fail("Value == 0 || Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x64c,"Gia_Man_t *Gia_ManDupCofactorVar(Gia_Man_t *, int, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pName = pcVar6;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pSpec = pcVar6;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  uVar10 = pVVar8->nSize;
  uVar12 = (ulong)uVar10;
  if (0 < (int)uVar10) {
    lVar14 = 0;
    do {
      uVar10 = (uint)uVar12;
      iVar1 = pVVar8->pArray[lVar14];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e1464;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) {
LAB_001e1483:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001e1483;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar8 = p->vCis;
      uVar10 = pVVar8->nSize;
      uVar12 = (ulong)(int)uVar10;
    } while (lVar14 < (long)uVar12);
  }
  if ((int)(uVar10 - p->nRegs) <= iVar) {
    __assert_fail("v < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
  }
  if ((int)uVar10 <= iVar) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = pVVar8->pArray[(uint)iVar];
  if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001e1464:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  p->pObjs[iVar1].Value = Value;
  Gia_ManHashAlloc(p_00);
  pVVar8 = p->vCos;
  uVar12 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      iVar11 = (int)uVar12;
      iVar1 = pVVar8->pArray[lVar14];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e1464;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      Gia_ManDupCofactorVar_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar14 = lVar14 + 1;
      pVVar8 = p->vCos;
      iVar11 = pVVar8->nSize;
      uVar12 = (ulong)iVar11;
    } while (lVar14 < (long)uVar12);
    if (0 < iVar11) {
      lVar14 = 0;
      do {
        iVar1 = pVVar8->pArray[lVar14];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e1464;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        uVar13 = (uint)*(undefined8 *)pGVar3;
        uVar10 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
        if ((int)uVar10 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar10);
        lVar14 = lVar14 + 1;
        pVVar8 = p->vCos;
      } while (lVar14 < pVVar8->nSize);
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  pGVar9 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( iVar >= 0 && iVar < Gia_ManPiNum(p) );
    assert( Value == 0 || Value == 1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManPi( p, iVar )->Value = Value; // modification!
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupCofactorVar_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}